

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanojson3.h
# Opt level: O0

json * __thiscall
nanojson3::json::json_reader<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::read_string
          (json *__return_storage_ptr__,
          json_reader<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *this)

{
  bool bVar1;
  int_type iVar2;
  uint uVar3;
  input_stream *piVar4;
  bad_format *pbVar5;
  optional<int> local_120;
  string_view local_118;
  int_type local_104;
  optional<int> local_100;
  string_view local_f8;
  optional<int> local_e0;
  string_view local_d8;
  optional<int> local_c0;
  string_view local_b8;
  optional<int> local_a0;
  string_view local_98;
  uint local_88;
  int_type local_84;
  int code2;
  string_view local_78 [2];
  int_type local_54;
  optional<int> local_50;
  string_view local_48;
  uint local_34;
  anon_class_8_1_8991fb9c aStack_30;
  int code;
  anon_class_8_1_8991fb9c hex;
  js_string *ret;
  json_reader<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pjStack_18;
  int_type quote;
  json_reader<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *this_local;
  
  pjStack_18 = this;
  this_local = (json_reader<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)
               __return_storage_ptr__;
  iVar2 = input_stream::operator*(&this->input_);
  if (iVar2 != 0x22) {
    __assert_fail("*input_ == \'\"\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ttsuki[P]nanojson/nanojson3.h"
                  ,0x471,
                  "json nanojson3::json::json_reader<std::istreambuf_iterator<char>>::read_string() [CharInputIterator = std::istreambuf_iterator<char>]"
                 );
  }
  ret._0_4_ = input_stream::operator++(&this->input_,0);
  ret._4_4_ = iter::operator*((iter *)&ret);
  hex.this = (json_reader<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)
             &this->string_input_buffer_;
  std::__cxx11::string::clear();
  do {
    bVar1 = input_stream::eat(&this->input_,0x5c);
    if (bVar1) {
      iVar2 = input_stream::operator*(&this->input_);
      if (iVar2 == 0x6e) {
        std::__cxx11::string::operator+=((string *)hex.this,'\n');
      }
      else {
        iVar2 = input_stream::operator*(&this->input_);
        if (iVar2 == 0x74) {
          std::__cxx11::string::operator+=((string *)hex.this,'\t');
        }
        else {
          iVar2 = input_stream::operator*(&this->input_);
          if (iVar2 == 0x62) {
            std::__cxx11::string::operator+=((string *)hex.this,'\b');
          }
          else {
            iVar2 = input_stream::operator*(&this->input_);
            if (iVar2 == 0x66) {
              std::__cxx11::string::operator+=((string *)hex.this,'\f');
            }
            else {
              iVar2 = input_stream::operator*(&this->input_);
              if (iVar2 == 0x72) {
                std::__cxx11::string::operator+=((string *)hex.this,'\r');
              }
              else {
                iVar2 = input_stream::operator*(&this->input_);
                if (iVar2 == 0x5c) {
                  std::__cxx11::string::operator+=((string *)hex.this,'\\');
                }
                else {
                  iVar2 = input_stream::operator*(&this->input_);
                  if (iVar2 == 0x2f) {
                    std::__cxx11::string::operator+=((string *)hex.this,'/');
                  }
                  else {
                    iVar2 = input_stream::operator*(&this->input_);
                    if (iVar2 == 0x22) {
                      std::__cxx11::string::operator+=((string *)hex.this,'\"');
                    }
                    else {
                      iVar2 = input_stream::operator*(&this->input_);
                      if (iVar2 == 0x27) {
                        std::__cxx11::string::operator+=((string *)hex.this,'\'');
                      }
                      else {
                        iVar2 = input_stream::operator*(&this->input_);
                        if (iVar2 != 0x75) {
                          pbVar5 = (bad_format *)__cxa_allocate_exception(0x10);
                          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                    (&local_b8,"invalid string format: invalid escape sequence");
                          std::optional<int>::optional(&local_c0);
                          bad_format(pbVar5,this,local_b8,local_c0);
                          __cxa_throw(pbVar5,&exceptions::bad_format::typeinfo,
                                      exceptions::bad_format::~bad_format);
                        }
                        local_34 = 0;
                        aStack_30.this = this;
                        piVar4 = input_stream::operator++(&this->input_);
                        iVar2 = input_stream::operator*(piVar4);
                        local_34 = read_string::anon_class_8_1_8991fb9c::operator()
                                             (&stack0xffffffffffffffd0,iVar2);
                        uVar3 = local_34 << 4;
                        piVar4 = input_stream::operator++(&this->input_);
                        iVar2 = input_stream::operator*(piVar4);
                        local_34 = read_string::anon_class_8_1_8991fb9c::operator()
                                             (&stack0xffffffffffffffd0,iVar2);
                        local_34 = uVar3 | local_34;
                        uVar3 = local_34 << 4;
                        piVar4 = input_stream::operator++(&this->input_);
                        iVar2 = input_stream::operator*(piVar4);
                        local_34 = read_string::anon_class_8_1_8991fb9c::operator()
                                             (&stack0xffffffffffffffd0,iVar2);
                        local_34 = uVar3 | local_34;
                        uVar3 = local_34 << 4;
                        piVar4 = input_stream::operator++(&this->input_);
                        iVar2 = input_stream::operator*(piVar4);
                        local_34 = read_string::anon_class_8_1_8991fb9c::operator()
                                             (&stack0xffffffffffffffd0,iVar2);
                        local_34 = uVar3 | local_34;
                        if ((int)local_34 < 0x80) {
                          std::__cxx11::string::operator+=((string *)hex.this,(byte)local_34 & 0x7f)
                          ;
                        }
                        else if ((int)local_34 < 0x800) {
                          std::__cxx11::string::operator+=
                                    ((string *)hex.this,(byte)((int)local_34 >> 6) & 0x1f | 0xc0);
                          std::__cxx11::string::operator+=
                                    ((string *)hex.this,(byte)local_34 & 0x3f | 0x80);
                        }
                        else if ((local_34 & 0xf800) == 0xd800) {
                          piVar4 = input_stream::operator++(&this->input_);
                          iVar2 = input_stream::operator*(piVar4);
                          if (iVar2 != 0x5c) {
                            pbVar5 = (bad_format *)__cxa_allocate_exception(0x10);
                            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                      (&local_48,"invalid string format: expected surrogate pair");
                            local_54 = input_stream::operator*(&this->input_);
                            std::optional<int>::optional<int,_true>(&local_50,&local_54);
                            bad_format(pbVar5,this,local_48,local_50);
                            __cxa_throw(pbVar5,&exceptions::bad_format::typeinfo,
                                        exceptions::bad_format::~bad_format);
                          }
                          piVar4 = input_stream::operator++(&this->input_);
                          iVar2 = input_stream::operator*(piVar4);
                          if (iVar2 != 0x75) {
                            pbVar5 = (bad_format *)__cxa_allocate_exception(0x10);
                            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                      (local_78,"invalid string format: expected surrogate pair");
                            local_84 = input_stream::operator*(&this->input_);
                            std::optional<int>::optional<int,_true>
                                      ((optional<int> *)&code2,&local_84);
                            bad_format(pbVar5,this,local_78[0],(optional<int>)_code2);
                            __cxa_throw(pbVar5,&exceptions::bad_format::typeinfo,
                                        exceptions::bad_format::~bad_format);
                          }
                          local_88 = 0;
                          piVar4 = input_stream::operator++(&this->input_);
                          iVar2 = input_stream::operator*(piVar4);
                          local_88 = read_string::anon_class_8_1_8991fb9c::operator()
                                               (&stack0xffffffffffffffd0,iVar2);
                          uVar3 = local_88 << 4;
                          piVar4 = input_stream::operator++(&this->input_);
                          iVar2 = input_stream::operator*(piVar4);
                          local_88 = read_string::anon_class_8_1_8991fb9c::operator()
                                               (&stack0xffffffffffffffd0,iVar2);
                          local_88 = uVar3 | local_88;
                          uVar3 = local_88 << 4;
                          piVar4 = input_stream::operator++(&this->input_);
                          iVar2 = input_stream::operator*(piVar4);
                          local_88 = read_string::anon_class_8_1_8991fb9c::operator()
                                               (&stack0xffffffffffffffd0,iVar2);
                          local_88 = uVar3 | local_88;
                          uVar3 = local_88 << 4;
                          piVar4 = input_stream::operator++(&this->input_);
                          iVar2 = input_stream::operator*(piVar4);
                          local_88 = read_string::anon_class_8_1_8991fb9c::operator()
                                               (&stack0xffffffffffffffd0,iVar2);
                          local_88 = uVar3 | local_88;
                          if (((local_34 & 0xfc00) == 0xdc00) && ((local_88 & 0xfc00) == 0xd800)) {
                            std::swap<int>((int *)&local_34,(int *)&local_88);
                          }
                          if (((local_34 & 0xfc00) != 0xd800) || ((local_88 & 0xfc00) != 0xdc00)) {
                            pbVar5 = (bad_format *)__cxa_allocate_exception(0x10);
                            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                      (&local_98,
                                       "invalid string format: invalid surrogate pair sequence");
                            std::optional<int>::optional(&local_a0);
                            bad_format(pbVar5,this,local_98,local_a0);
                            __cxa_throw(pbVar5,&exceptions::bad_format::typeinfo,
                                        exceptions::bad_format::~bad_format);
                          }
                          local_34 = ((local_34 & 0x3ff) << 10 | local_88 & 0x3ff) + 0x10000;
                          std::__cxx11::string::operator+=
                                    ((string *)hex.this,(byte)((int)local_34 >> 0x12) | 0xf0);
                          std::__cxx11::string::operator+=
                                    ((string *)hex.this,(byte)((int)local_34 >> 0xc) & 0x3f | 0x80);
                          std::__cxx11::string::operator+=
                                    ((string *)hex.this,(byte)((int)local_34 >> 6) & 0x3f | 0x80);
                          std::__cxx11::string::operator+=
                                    ((string *)hex.this,(byte)local_34 & 0x3f | 0x80);
                        }
                        else {
                          std::__cxx11::string::operator+=
                                    ((string *)hex.this,(byte)((int)local_34 >> 0xc) & 0xf | 0xe0);
                          std::__cxx11::string::operator+=
                                    ((string *)hex.this,(byte)((int)local_34 >> 6) & 0x3f | 0x80);
                          std::__cxx11::string::operator+=
                                    ((string *)hex.this,(byte)local_34 & 0x3f | 0x80);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      bVar1 = input_stream::eat(&this->input_,ret._4_4_);
      if (bVar1) {
        json<(nanojson3::json_type_index)5,std::__cxx11::string&>(__return_storage_ptr__,hex.this);
        return __return_storage_ptr__;
      }
      iVar2 = input_stream::operator*(&this->input_);
      if (iVar2 == -1) {
        pbVar5 = (bad_format *)__cxa_allocate_exception(0x10);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_d8,"invalid string format: unexpected eof");
        std::optional<int>::optional(&local_e0);
        bad_format(pbVar5,this,local_d8,local_e0);
        __cxa_throw(pbVar5,&exceptions::bad_format::typeinfo,exceptions::bad_format::~bad_format);
      }
      iVar2 = input_stream::operator*(&this->input_);
      if ((iVar2 < 0x20) || (iVar2 = input_stream::operator*(&this->input_), iVar2 == 0x7f)) {
        pbVar5 = (bad_format *)__cxa_allocate_exception(0x10);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_f8,"invalid string format: control character is not allowed");
        local_104 = input_stream::operator*(&this->input_);
        std::optional<int>::optional<int,_true>(&local_100,&local_104);
        bad_format(pbVar5,this,local_f8,local_100);
        __cxa_throw(pbVar5,&exceptions::bad_format::typeinfo,exceptions::bad_format::~bad_format);
      }
      iVar2 = input_stream::operator*(&this->input_);
      if ((iVar2 == 0x2f) && (bVar1 = has_option(this,allow_unescaped_forward_slash), !bVar1)) {
        pbVar5 = (bad_format *)__cxa_allocate_exception(0x10);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_118,"invalid string format: unescaped \'/\' is not allowed");
        std::optional<int>::optional(&local_120);
        bad_format(pbVar5,this,local_118,local_120);
        __cxa_throw(pbVar5,&exceptions::bad_format::typeinfo,exceptions::bad_format::~bad_format);
      }
      iVar2 = input_stream::operator*(&this->input_);
      std::__cxx11::string::operator+=((string *)hex.this,(char)iVar2);
    }
    input_stream::operator++(&this->input_);
  } while( true );
}

Assistant:

json read_string()
        {
            // check quote character
            assert(*input_ == '"');
            int_type quote = *input_++; // '"'

            auto& ret = string_input_buffer_;
            ret.clear();

            while (true)
            {
                if (input_.eat('\\')) // escape sequence found?
                {
                    if (*input_ == 'n') ret += '\n';
                    else if (*input_ == 't') ret += '\t';
                    else if (*input_ == 'b') ret += '\b';
                    else if (*input_ == 'f') ret += '\f';
                    else if (*input_ == 'r') ret += '\r';
                    else if (*input_ == '\\') ret += '\\';
                    else if (*input_ == '/') ret += '/';
                    else if (*input_ == '\"') ret += '\"';
                    else if (*input_ == '\'') ret += '\'';
                    else if (*input_ == 'u') // \uXXXX is converted to UTF-8 sequence
                    {
                        auto hex = [&](int_type chr)
                        {
                            if (chr >= '0' && chr <= '9') { return chr - '0'; }
                            if (chr >= 'A' && chr <= 'F') { return chr - 'A' + 10; }
                            if (chr >= 'a' && chr <= 'f') { return chr - 'a' + 10; }
                            throw bad_format("invalid string format: expected hexadecimal digit for \\u????", chr);
                        };

                        int code = 0;
                        code = code << 4 | hex(*++input_);
                        code = code << 4 | hex(*++input_);
                        code = code << 4 | hex(*++input_);
                        code = code << 4 | hex(*++input_);

                        if (code < 0x80) // 7 bit
                        {
                            ret += static_cast<char>((code >> 0 & 0x7F) | 0x00);
                        }
                        else if (code < 0x0800) // 11 bit
                        {
                            ret += static_cast<char>((code >> 6 & 0x1f) | 0xC0);
                            ret += static_cast<char>((code >> 0 & 0x3f) | 0x80);
                        }
                        else if ((code & 0xF800) == 0xD800) // surrogate pair
                        {
                            // assume next surrogate is following.
                            if (*++input_ != '\\') throw bad_format("invalid string format: expected surrogate pair", *input_);
                            if (*++input_ != 'u') throw bad_format("invalid string format: expected surrogate pair", *input_);

                            int code2 = 0;
                            code2 = code2 << 4 | hex(*++input_);
                            code2 = code2 << 4 | hex(*++input_);
                            code2 = code2 << 4 | hex(*++input_);
                            code2 = code2 << 4 | hex(*++input_);

                            if ((code & 0xFC00) == 0xDC00 && (code2 & 0xFC00) == 0xD800)
                                std::swap(code, code2);

                            if ((code & 0xFC00) == 0xD800 && (code2 & 0xFC00) == 0xDC00)
                                code = ((code & 0x3FF) << 10 | (code2 & 0x3FF)) + 0x10000; // 21 bit
                            else
                                throw bad_format("invalid string format: invalid surrogate pair sequence");

                            ret += static_cast<char>((code >> 18 & 0x07) | 0xF0);
                            ret += static_cast<char>((code >> 12 & 0x3f) | 0x80);
                            ret += static_cast<char>((code >> 6 & 0x3f) | 0x80);
                            ret += static_cast<char>((code >> 0 & 0x3f) | 0x80);
                        }
                        else // 16 bit
                        {
                            ret += static_cast<char>((code >> 12 & 0x0f) | 0xE0);
                            ret += static_cast<char>((code >> 6 & 0x3f) | 0x80);
                            ret += static_cast<char>((code >> 0 & 0x3f) | 0x80);
                        }
                    }
                    else
                    {
                        throw bad_format("invalid string format: invalid escape sequence");
                    }
                }
                else if (input_.eat(quote)) break; // end of string.
                else if (*input_ == EOF) throw bad_format("invalid string format: unexpected eof");
                else if (*input_ < 0x20 || *input_ == 0x7F) throw bad_format("invalid string format: control character is not allowed", *input_);
                else if (*input_ == '/' && !has_option(json_parse_option::allow_unescaped_forward_slash)) throw bad_format("invalid string format: unescaped '/' is not allowed");
                else ret += static_cast<char_type>(*input_); // OK. normal character.
                ++input_;
            }

            return json{in_place_index::string, ret}; // copy
        }